

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,char *__file,__off_t __length
          )

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  int in_EAX;
  int extraout_EAX;
  Own<capnp::ClientHook> *this_00;
  
  pMVar1 = this->ptr;
  while (pMVar1 + (long)__file < this->pos) {
    this_00 = &this->pos[-1].ptr;
    this->pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)this_00;
    Own<capnp::ClientHook>::dispose(this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }